

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

Int __thiscall ipx::Basis::Factorize(Basis *this)

{
  bool bVar1;
  Int IVar2;
  uint uVar3;
  reference pvVar4;
  ostream *poVar5;
  undefined8 *in_RDI;
  double dVar6;
  Basis *in_stack_000000a8;
  Int flag;
  Int err;
  Int i;
  vector<int,_std::allocator<int>_> end;
  vector<int,_std::allocator<int>_> begin;
  Timer timer;
  SparseMatrix *AI;
  Int m;
  undefined4 in_stack_fffffffffffffeb8;
  Int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Int *in_stack_fffffffffffffec8;
  allocator_type *in_stack_fffffffffffffed0;
  Int *in_stack_fffffffffffffed8;
  LuUpdate *in_stack_fffffffffffffee0;
  Int local_74;
  int local_70;
  Basis *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> local_38;
  SparseMatrix *local_18;
  Int local_c;
  
  local_c = Model::rows((Model *)in_RDI[1]);
  local_18 = Model::AI((Model *)in_RDI[1]);
  Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::allocator<int>::allocator((allocator<int> *)0x80ab2c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
             (size_type)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<int>::~allocator((allocator<int> *)0x80ab58);
  std::allocator<int>::allocator((allocator<int> *)0x80ab7d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
             (size_type)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<int>::~allocator((allocator<int> *)0x80aba9);
  for (local_70 = 0; local_70 < local_c; local_70 = local_70 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_70);
    IVar2 = SparseMatrix::begin((SparseMatrix *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffebc);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_70);
    *pvVar4 = IVar2;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_70);
    IVar2 = SparseMatrix::end((SparseMatrix *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffebc);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff98,(long)local_70
                       );
    *pvVar4 = IVar2;
  }
  local_74 = 0;
  do {
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80ad2c);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80ad3e);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80ad50);
    SparseMatrix::rowidx((SparseMatrix *)0x80ad62);
    SparseMatrix::values((SparseMatrix *)0x80ad76);
    uVar3 = LuUpdate::Factorize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                (Int *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                (double *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                SUB41((uint)in_stack_fffffffffffffebc >> 0x18,0));
    *(int *)((long)in_RDI + 0x4c) = *(int *)((long)in_RDI + 0x4c) + 1;
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80add6);
    LuUpdate::fill_factor((LuUpdate *)0x80adde);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
              );
    if ((uVar3 & 2) != 0) {
      AdaptToSingularFactorization(in_stack_ffffffffffffffa0);
      local_74 = 0x12d;
      goto LAB_0080aef8;
    }
  } while (((uVar3 & 1) != 0) && (bVar1 = TightenLuPivotTol(in_stack_000000a8), bVar1));
  if ((uVar3 & 1) != 0) {
    poVar5 = Control::Debug((Control *)*in_RDI,3);
    poVar5 = std::operator<<(poVar5," LU factorization unstable with pivot tolerance ");
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80aebc);
    dVar6 = LuUpdate::pivottol((LuUpdate *)0x80aec4);
    in_stack_fffffffffffffed0 = (allocator_type *)std::ostream::operator<<(poVar5,dVar6);
    std::operator<<((ostream *)in_stack_fffffffffffffed0,'\n');
  }
LAB_0080aef8:
  dVar6 = Timer::Elapsed((Timer *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  in_RDI[0x10] = dVar6 + (double)in_RDI[0x10];
  *(undefined1 *)(in_RDI + 9) = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0);
  return local_74;
}

Assistant:

Int Basis::Factorize() {
    const Int m = model_.rows();
    const SparseMatrix& AI = model_.AI();
    Timer timer;

    // Build column pointers for passing to LU factorization.
    std::vector<Int> begin(m), end(m);
    for (Int i = 0; i < m; i++) {
        assert(basis_[i] >= 0);
        begin[i] = AI.begin(basis_[i]);
        end[i] = AI.end(basis_[i]);
    }

    Int err = 0;                // return code
    while (true) {
        Int flag = lu_->Factorize(begin.data(), end.data(), AI.rowidx(),
                                  AI.values(), false);
        num_factorizations_++;
        fill_factors_.push_back(lu_->fill_factor());
        if (flag & 2) {
            AdaptToSingularFactorization();
            err = IPX_ERROR_basis_singular;
            break;
        }
        if ((flag & 1) && TightenLuPivotTol()) {
            // The factorization was numerically unstable and the pivot
            // tolerance could be tightened. Repeat.
            continue;
        }
        if (flag & 1) {
            control_.Debug(3)
                << " LU factorization unstable with pivot tolerance "
                << lu_->pivottol() << '\n';
            // ignore instability
        }
        break;
    }
    time_factorize_ += timer.Elapsed();
    factorization_is_fresh_ = true;
    return err;
}